

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

ON_Viewport * __thiscall ON_Viewport::ShallowCopy(ON_Viewport *this,ON_Viewport *destination)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  ON_Viewport *local_20;
  ON_Viewport *destination_local;
  ON_Viewport *this_local;
  
  if (destination == (ON_Viewport *)0x0) {
    local_20 = (ON_Viewport *)operator_new(0x248);
    memset(local_20,0,0x248);
    ON_Viewport(local_20);
  }
  else {
    ON_Object::PurgeUserData((ON_Object *)destination);
    if (this == destination) {
      return destination;
    }
    operator=(destination,&DefaultTopViewYUp);
    local_20 = destination;
  }
  local_20->m_bValidCamera = (bool)(this->m_bValidCamera & 1);
  local_20->m_bValidFrustum = (bool)(this->m_bValidFrustum & 1);
  local_20->m_bValidPort = (bool)(this->m_bValidPort & 1);
  local_20->m_bValidCameraFrame = (bool)(this->m_bValidCameraFrame & 1);
  local_20->m_projection = this->m_projection;
  local_20->m_bLockCamUp = (bool)(this->m_bLockCamUp & 1);
  local_20->m_bLockCamDir = (bool)(this->m_bLockCamDir & 1);
  local_20->m_bLockCamLoc = (bool)(this->m_bLockCamLoc & 1);
  local_20->m_frustum_symmetry_flags = this->m_frustum_symmetry_flags;
  (local_20->m_CamLoc).x = (this->m_CamLoc).x;
  (local_20->m_CamLoc).y = (this->m_CamLoc).y;
  (local_20->m_CamLoc).z = (this->m_CamLoc).z;
  (local_20->m_CamDir).x = (this->m_CamDir).x;
  (local_20->m_CamDir).y = (this->m_CamDir).y;
  (local_20->m_CamDir).z = (this->m_CamDir).z;
  (local_20->m_CamUp).x = (this->m_CamUp).x;
  (local_20->m_CamUp).y = (this->m_CamUp).y;
  (local_20->m_CamUp).z = (this->m_CamUp).z;
  (local_20->m_CamX).x = (this->m_CamX).x;
  (local_20->m_CamX).y = (this->m_CamX).y;
  (local_20->m_CamX).z = (this->m_CamX).z;
  (local_20->m_CamY).x = (this->m_CamY).x;
  (local_20->m_CamY).y = (this->m_CamY).y;
  (local_20->m_CamY).z = (this->m_CamY).z;
  (local_20->m_CamZ).x = (this->m_CamZ).x;
  (local_20->m_CamZ).y = (this->m_CamZ).y;
  (local_20->m_CamZ).z = (this->m_CamZ).z;
  local_20->m_frus_left = this->m_frus_left;
  local_20->m_frus_right = this->m_frus_right;
  local_20->m_frus_bottom = this->m_frus_bottom;
  local_20->m_frus_top = this->m_frus_top;
  local_20->m_frus_near = this->m_frus_near;
  local_20->m_frus_far = this->m_frus_far;
  local_20->m_port_left = this->m_port_left;
  local_20->m_port_right = this->m_port_right;
  local_20->m_port_bottom = this->m_port_bottom;
  local_20->m_port_top = this->m_port_top;
  local_20->m_port_near = this->m_port_near;
  local_20->m_port_far = this->m_port_far;
  (local_20->m_target_point).x = (this->m_target_point).x;
  (local_20->m_target_point).y = (this->m_target_point).y;
  (local_20->m_target_point).z = (this->m_target_point).z;
  uVar1 = (this->m_viewport_id).Data2;
  uVar2 = (this->m_viewport_id).Data3;
  (local_20->m_viewport_id).Data1 = (this->m_viewport_id).Data1;
  (local_20->m_viewport_id).Data2 = uVar1;
  (local_20->m_viewport_id).Data3 = uVar2;
  *(undefined8 *)(local_20->m_viewport_id).Data4 = *(undefined8 *)(this->m_viewport_id).Data4;
  memcpy(&local_20->m_clip_mods,&this->m_clip_mods,0x80);
  memcpy(&local_20->m_clip_mods_inverse,&this->m_clip_mods_inverse,0x80);
  local_20->m__MIN_NEAR_DIST = this->m__MIN_NEAR_DIST;
  local_20->m__MIN_NEAR_OVER_FAR = this->m__MIN_NEAR_OVER_FAR;
  return local_20;
}

Assistant:

ON_Viewport* ON_Viewport::ShallowCopy(ON_Viewport* destination) const
{
  if (nullptr == destination)
    destination = new ON_Viewport();
  else
  {
    destination->PurgeUserData();
    if (this == destination)
      return destination; // The caller is probably confused but this is what they should get.
    *destination = ON_Viewport::DefaultTopViewYUp; // default ctor values
  }

#define ON_INTERNAL_SHALLOW_FIELD_COPY(field) destination->field = this->field
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bValidCamera);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bValidFrustum);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bValidPort);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bValidCameraFrame);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_projection);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bLockCamUp);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bLockCamDir);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_bLockCamLoc);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frustum_symmetry_flags);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_CamLoc);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_CamDir);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_CamUp);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_CamX);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_CamY);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_CamZ);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frus_left);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frus_right);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frus_bottom);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frus_top);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frus_near);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_frus_far);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_port_left);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_port_right);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_port_bottom);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_port_top);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_port_near);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_port_far);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_target_point);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_viewport_id);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_clip_mods);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m_clip_mods_inverse);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m__MIN_NEAR_DIST);
  ON_INTERNAL_SHALLOW_FIELD_COPY(m__MIN_NEAR_OVER_FAR);
#undef ON_INTERNAL_SHALLOW_COPY
  return destination;
}